

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlayoutengine_p.h
# Opt level: O2

void qMaxExpCalc(int *max,bool *exp,bool *empty,int boxmax,bool boxexp,bool boxempty)

{
  bool bVar1;
  
  bVar1 = *exp;
  if (bVar1 == true) {
    if (!boxexp) goto LAB_002dfd9a;
    if (boxmax < *max) {
      boxmax = *max;
    }
  }
  else if ((!boxexp) && ((*empty != true || ((boxempty && (*max != 0)))))) {
    if (*empty != boxempty) goto LAB_002dfd9a;
    if (*max < boxmax) {
      boxmax = *max;
    }
  }
  *max = boxmax;
LAB_002dfd9a:
  *exp = (bool)(bVar1 | boxexp);
  *empty = (bool)(*empty & boxempty);
  return;
}

Assistant:

static inline void qMaxExpCalc(int & max, bool &exp, bool &empty,
                               int boxmax, bool boxexp, bool boxempty)
{
    if (exp) {
        if (boxexp)
            max = qMax(max, boxmax);
    } else {
        if (boxexp || (empty && (!boxempty || max == 0)))
            max = boxmax;
        else if (empty == boxempty)
            max = qMin(max, boxmax);
    }
    exp = exp || boxexp;
    empty = empty && boxempty;
}